

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

IndependentSampler *
pbrt::IndependentSampler::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  IndependentSampler *pIVar4;
  int *in_RDI;
  int seed;
  int ns;
  string *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  polymorphic_allocator<std::byte> *this;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator<char> local_41;
  string local_40 [36];
  int local_1c;
  int *local_10;
  
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  iVar2 = ParameterDictionary::GetOneInt
                    ((ParameterDictionary *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48,0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  local_1c = iVar2;
  bVar1 = pstd::optional::operator_cast_to_bool((optional *)(Options + 0x44));
  if (bVar1) {
    piVar3 = pstd::optional<int>::operator*((optional<int> *)0x940178);
    local_1c = *piVar3;
  }
  this = (polymorphic_allocator<std::byte> *)&stack0xffffffffffffff87;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  iVar2 = ParameterDictionary::GetOneInt
                    ((ParameterDictionary *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48,0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  pIVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::IndependentSampler,int&,int&>
                     (this,local_10,(int *)CONCAT44(iVar2,in_stack_ffffffffffffff50));
  return pIVar4;
}

Assistant:

IndependentSampler *IndependentSampler::Create(const ParameterDictionary &parameters,
                                               const FileLoc *loc, Allocator alloc) {
    int ns = parameters.GetOneInt("pixelsamples", 4);
    if (Options->pixelSamples)
        ns = *Options->pixelSamples;
    int seed = parameters.GetOneInt("seed", Options->seed);
    return alloc.new_object<IndependentSampler>(ns, seed);
}